

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

VariableID __thiscall spirv_cross::Compiler::build_dummy_sampler_for_combined_images(Compiler *this)

{
  uint32_t id;
  SPIRFunction *func;
  SPIRType *pSVar1;
  SPIRType *this_00;
  ID id_00;
  int local_78;
  uint32_t ptr_type_id;
  ParsedIR *local_70;
  string local_68;
  DummySamplerForCombinedImageHandler handler;
  
  handler.super_OpcodeHandler._vptr_OpcodeHandler = (_func_int **)&PTR__OpcodeHandler_003555f8;
  handler.need_dummy_sampler = false;
  handler.compiler = this;
  func = get<spirv_cross::SPIRFunction>(this,(this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,func,&handler.super_OpcodeHandler);
  id_00.id = 0;
  if (handler.need_dummy_sampler == true) {
    local_70 = &this->ir;
    id = ParsedIR::increase_bound_by(local_70,3);
    id_00.id = id + 2;
    local_68._M_dataplus._M_p._0_4_ = 0x1a;
    ptr_type_id = id + 1;
    pSVar1 = set<spirv_cross::SPIRType,spv::Op>(this,id,(Op *)&local_68);
    pSVar1->basetype = Sampler;
    local_68._M_dataplus._M_p._0_4_ = 0x20;
    this_00 = set<spirv_cross::SPIRType,spv::Op>(this,id + 1,(Op *)&local_68);
    SPIRType::operator=(this_00,pSVar1);
    (this_00->super_IVariant).self.id = id;
    this_00->storage = StorageClassUniformConstant;
    this_00->pointer = true;
    (this_00->parent_type).id = id;
    local_68._M_dataplus._M_p._0_4_ = 0;
    local_78 = 0;
    set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
              (this,id_00.id,&ptr_type_id,(StorageClass *)&local_68,&local_78);
    ::std::__cxx11::string::string
              ((string *)&local_68,"SPIRV_Cross_DummySampler",(allocator *)&local_78);
    ParsedIR::set_name(local_70,id_00,&local_68);
    ::std::__cxx11::string::~string((string *)&local_68);
    this->dummy_sampler_id = id_00.id;
  }
  return (VariableID)id_00.id;
}

Assistant:

VariableID Compiler::build_dummy_sampler_for_combined_images()
{
	DummySamplerForCombinedImageHandler handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
	if (handler.need_dummy_sampler)
	{
		uint32_t offset = ir.increase_bound_by(3);
		auto type_id = offset + 0;
		auto ptr_type_id = offset + 1;
		auto var_id = offset + 2;

		auto &sampler = set<SPIRType>(type_id, OpTypeSampler);
		sampler.basetype = SPIRType::Sampler;

		auto &ptr_sampler = set<SPIRType>(ptr_type_id, OpTypePointer);
		ptr_sampler = sampler;
		ptr_sampler.self = type_id;
		ptr_sampler.storage = StorageClassUniformConstant;
		ptr_sampler.pointer = true;
		ptr_sampler.parent_type = type_id;

		set<SPIRVariable>(var_id, ptr_type_id, StorageClassUniformConstant, 0);
		set_name(var_id, "SPIRV_Cross_DummySampler");
		dummy_sampler_id = var_id;
		return var_id;
	}
	else
		return 0;
}